

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.h
# Opt level: O0

bool __thiscall Group::intersect(Group *this,Ray *r,Hit *h,float tmin)

{
  bool bVar1;
  uint uVar2;
  reference piVar3;
  long *in_RDX;
  Vector3f *in_RDI;
  float fVar4;
  int g;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  bool ok;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  undefined1 uVar5;
  Hit *in_stack_ffffffffffffffa0;
  Ray *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  Vector3f *local_30;
  byte local_25;
  long *local_20;
  bool local_1;
  
  local_20 = in_RDX;
  bVar1 = std::vector<Object_*,_std::allocator<Object_*>_>::empty
                    ((vector<Object_*,_std::allocator<Object_*>_> *)in_stack_ffffffffffffffa0);
  if (bVar1) {
    local_1 = false;
  }
  else {
    local_25 = 0;
    local_30 = in_RDI + 10;
    local_38._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff88);
    std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff88);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_ffffffffffffff88), bVar1) {
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_38);
      bVar1 = intersect((Group *)CONCAT44(*piVar3,in_stack_ffffffffffffffb8),
                        in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
                        in_stack_ffffffffffffffa0,(float)((ulong)in_RDI >> 0x20));
      local_25 = (local_25 & 1) != 0 || bVar1;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_38);
    }
    uVar5 = false;
    if ((local_25 & 1) != 0) {
      uVar2 = (**(code **)(**(long **)(*local_20 + 0x10) + 0x18))();
      uVar5 = false;
      if ((uVar2 & 1) != 0) {
        in_stack_ffffffffffffff88 = (vector<int,_std::allocator<int>_> *)((long)local_20 + 0xc);
        ::operator-(in_RDI);
        fVar4 = Vector3f::dot((Vector3f *)in_stack_ffffffffffffffa0,in_RDI);
        uVar5 = fVar4 < 0.0;
      }
    }
    if ((bool)uVar5 != false) {
      ::operator-(in_RDI);
      Vector3f::operator=((Vector3f *)CONCAT17(uVar5,in_stack_ffffffffffffff90),
                          (Vector3f *)in_stack_ffffffffffffff88);
    }
    local_1 = (bool)(local_25 & 1);
  }
  return local_1;
}

Assistant:

bool intersect(const Ray& r, Hit& h, float tmin) {
#ifdef NOKD
		bool ok = 0;
		for (auto o : obj)
			if (o) ok |= o->intersect(r, h, tmin);
		return ok;
#else
		if (obj.empty()) return 0;
//		std::cerr << "INTERSECT TEST:" << obj.size() << "\n";
		bool ok = 0;
		for (auto g : rs)
			ok |= intersect(g, r, h, tmin);
		if (ok && h.obj->m->fix_norm() && Vector3f::dot(h.norm, -r.d) < 0)
			h.norm = -h.norm;
		return ok;
#endif
	}